

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_183::InfoCollector::handleBreakValue(InfoCollector *this,Expression *curr)

{
  Id IVar1;
  bool bVar2;
  long lVar3;
  Switch *cast;
  ulong uVar4;
  ulong uVar5;
  anon_class_8_1_8991fb9c local_40;
  Expression *local_38;
  anon_class_16_2_3f140c08 local_30;
  
  local_30.func = &local_40;
  local_30.expr = &local_38;
  IVar1 = curr->_id;
  lVar3 = 0x10;
  local_40.this = this;
  local_38 = curr;
  if (IVar1 < RethrowId) {
    if (IVar1 < TryId) {
      if (IVar1 != BreakId) {
        if (IVar1 == SwitchId) {
          BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()(&local_30,(Name *)(curr + 3))
          ;
          if (curr[1].type.id == 0) {
            return;
          }
          uVar4 = 0;
          uVar5 = 1;
          do {
            BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                      (&local_30,(Name *)(uVar4 * 0x10 + *(long *)(curr + 1)));
            bVar2 = uVar5 < curr[1].type.id;
            uVar4 = uVar5;
            uVar5 = (ulong)((int)uVar5 + 1);
          } while (bVar2);
          return;
        }
        if (IVar1 != InvalidId) {
          return;
        }
        goto LAB_00703007;
      }
    }
    else {
      if (IVar1 != TryId) {
        if (IVar1 != TryTableId) {
          return;
        }
        if (*(long *)(curr + 4) == 0) {
          return;
        }
        uVar4 = 0;
        uVar5 = 1;
        do {
          BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                    (&local_30,(Name *)(uVar4 * 0x10 + curr[3].type.id));
          bVar2 = uVar5 < *(ulong *)(curr + 4);
          uVar4 = uVar5;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (bVar2);
        return;
      }
      lVar3 = 0x68;
    }
  }
  else {
    if (SuspendId < IVar1) {
      if (IVar1 == ResumeId) {
        if (curr[3].type.id == 0) {
          return;
        }
        uVar4 = 0;
        uVar5 = 1;
        do {
          BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                    (&local_30,(Name *)(uVar4 * 0x10 + *(long *)(curr + 3)));
          bVar2 = uVar5 < curr[3].type.id;
          uVar4 = uVar5;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (bVar2);
        return;
      }
      if (IVar1 == ResumeThrowId) {
        if (curr[4].type.id == 0) {
          return;
        }
        uVar4 = 0;
        uVar5 = 1;
        do {
          BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                    (&local_30,(Name *)(uVar4 * 0x10 + *(long *)(curr + 4)));
          bVar2 = uVar5 < curr[4].type.id;
          uVar4 = uVar5;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (bVar2);
        return;
      }
      if (IVar1 != NumExpressionIds) {
        return;
      }
LAB_00703007:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                         ,0x103);
    }
    if (IVar1 != RethrowId) {
      if (IVar1 != BrOnId) {
        return;
      }
      lVar3 = 0x18;
    }
  }
  BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
            (&local_30,(Name *)(&curr->_id + lVar3));
  return;
}

Assistant:

void handleBreakValue(Expression* curr) {
    BranchUtils::operateOnScopeNameUsesAndSentValues(
      curr, [&](Name target, Expression* value) {
        if (value && isRelevant(value->type)) {
          for (Index i = 0; i < value->type.size(); i++) {
            // Breaks send the contents of the break value to the branch target
            // that the break goes to.
            info.links.push_back({ExpressionLocation{value, i},
                                  getBreakTargetLocation(target, i)});
          }
        }
      });
  }